

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_nonlin.c
# Opt level: O0

int main(void)

{
  int iVar1;
  SUNContext ctx;
  sunrealtype tout;
  sunrealtype t;
  FILE *FID;
  FILE *UFID;
  void *arkode_mem;
  N_Vector y;
  int flag;
  sunrealtype abstol;
  sunrealtype reltol;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  char *local_70;
  double local_68;
  FILE *local_60;
  FILE *local_58;
  undefined8 local_50;
  long *local_48;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  char *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (char *)0x4024000000000000;
  local_20 = 1.0;
  local_28 = 1;
  local_30 = 0x3eb0c6f7a0b5ed8d;
  local_38 = 0x3ddb7cdfd9d7bdbb;
  local_48 = (long *)0x0;
  local_50 = 0;
  local_3c = SUNContext_Create(0,&stack0xffffffffffffff88);
  iVar1 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (iVar1 == 0) {
    printf("\nAnalytical ODE test problem:\n");
    printf("   reltol = %.1e\n",local_30);
    printf("   abstol = %.1e\n\n",local_38);
    local_48 = (long *)N_VNew_Serial(local_28,in_stack_ffffffffffffff88);
    iVar1 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
    if (iVar1 == 0) {
      **(undefined8 **)(*local_48 + 0x10) = 0;
      local_50 = ERKStepCreate(local_10,f,local_48,in_stack_ffffffffffffff88);
      iVar1 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c);
      if (iVar1 == 0) {
        local_3c = ARKodeSStolerances(local_30,local_38,local_50);
        iVar1 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c);
        if (iVar1 == 0) {
          local_58 = fopen("solution.txt","w");
          fprintf(local_58,"# t u\n");
          fprintf(local_58," %.16e %.16e\n",local_10,**(undefined8 **)(*local_48 + 0x10));
          local_68 = local_10;
          local_70 = (char *)(local_10 + local_20);
          printf("        t           u\n");
          printf("   ---------------------\n");
          while (1e-15 < (double)local_18 - local_68) {
            local_3c = ARKodeEvolve(local_70,local_50,local_48,&local_68,1);
            iVar1 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffff7c);
            if (iVar1 != 0) break;
            printf("  %10.6f  %10.6f\n",local_68,**(undefined8 **)(*local_48 + 0x10));
            fprintf(local_58," %.16e %.16e\n",local_68,**(undefined8 **)(*local_48 + 0x10));
            if (local_3c < 0) {
              fprintf(_stderr,"Solver failure, stopping integration\n");
              break;
            }
            in_stack_ffffffffffffff80 = (char *)(local_20 + (double)local_70);
            local_70 = in_stack_ffffffffffffff80;
            if ((double)local_18 < (double)in_stack_ffffffffffffff80) {
              in_stack_ffffffffffffff80 = local_18;
              local_70 = local_18;
            }
          }
          printf("   ---------------------\n");
          fclose(local_58);
          printf("\nFinal Statistics:\n");
          local_3c = ARKodePrintAllStats(local_50,_stdout,0);
          local_60 = fopen("ark_analytic_nonlin_stats.csv","w");
          local_3c = ARKodePrintAllStats(local_50,local_60,1);
          fclose(local_60);
          N_VDestroy(local_48);
          ARKodeFree(&local_50);
          SUNContext_Free(&stack0xffffffffffffff88);
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);  /* time between outputs */
  sunindextype NEQ   = 1;                /* number of dependent vars. */
  sunrealtype reltol = 1.0e-6;           /* tolerances */
  sunrealtype abstol = 1.0e-10;

  /* general problem variables */
  int flag;                /* reusable error-checking flag */
  N_Vector y       = NULL; /* empty vector for storing solution */
  void* arkode_mem = NULL; /* empty ARKode memory structure */
  FILE *UFID, *FID;
  sunrealtype t, tout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nAnalytical ODE test problem:\n");
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = 0.0; /* Specify initial condition */

  /* Call ERKStepCreate to initialize the ERK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y. */
  arkode_mem = ERKStepCreate(f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ERKStepCreate", 0)) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Print final statistics */
  printf("\nFinal Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID  = fopen("ark_analytic_nonlin_stats.csv", "w");
  flag = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}